

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-quant.cpp
# Opt level: O1

llama_model_quantize_params * llama_model_quantize_default_params(void)

{
  llama_model_quantize_params *in_RDI;
  
  in_RDI->nthread = 0;
  in_RDI->ftype = LLAMA_FTYPE_ALL_F32;
  in_RDI->output_tensor_type = GGML_TYPE_F32;
  in_RDI->token_embedding_type = GGML_TYPE_F32;
  in_RDI->allow_requantize = false;
  in_RDI->quantize_output_tensor = false;
  in_RDI->only_copy = false;
  in_RDI->pure = false;
  in_RDI->keep_split = false;
  *(undefined3 *)&in_RDI->field_0x15 = 0;
  in_RDI->imatrix = (void *)0x0;
  in_RDI->kv_overrides = (void *)0x0;
  in_RDI->tensor_types = (void *)0x0;
  in_RDI->ftype = LLAMA_FTYPE_MOSTLY_Q5_1;
  in_RDI->output_tensor_type = GGML_TYPE_COUNT;
  in_RDI->token_embedding_type = GGML_TYPE_COUNT;
  in_RDI->quantize_output_tensor = true;
  return in_RDI;
}

Assistant:

llama_model_quantize_params llama_model_quantize_default_params() {
    llama_model_quantize_params result = {
        /*.nthread                     =*/ 0,
        /*.ftype                       =*/ LLAMA_FTYPE_MOSTLY_Q5_1,
        /*.output_tensor_type          =*/ GGML_TYPE_COUNT,
        /*.token_embedding_type        =*/ GGML_TYPE_COUNT,
        /*.allow_requantize            =*/ false,
        /*.quantize_output_tensor      =*/ true,
        /*.only_copy                   =*/ false,
        /*.pure                        =*/ false,
        /*.keep_split                  =*/ false,
        /*.imatrix                     =*/ nullptr,
        /*.kv_overrides                =*/ nullptr,
        /*.tensor_type                 =*/ nullptr,
    };

    return result;
}